

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

void __thiscall spirv_cross::ParsedIR::set_id_bounds(ParsedIR *this,uint32_t bounds)

{
  ObjectPoolGroup *in_RAX;
  ulong count;
  _Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false> local_28;
  
  count = (ulong)bounds;
  local_28._M_head_impl = in_RAX;
  SmallVector<spirv_cross::Variant,_8UL>::reserve(&this->ids,count);
  while ((this->ids).super_VectorView<spirv_cross::Variant>.buffer_size < count) {
    local_28._M_head_impl =
         (this->pool_group)._M_t.
         super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
         ._M_t.
         super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
         .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    SmallVector<spirv_cross::Variant,8ul>::emplace_back<spirv_cross::ObjectPoolGroup*>
              ((SmallVector<spirv_cross::Variant,8ul> *)&this->ids,&local_28._M_head_impl);
  }
  SmallVector<unsigned_char,_8UL>::resize(&this->block_meta,count);
  return;
}

Assistant:

void ParsedIR::set_id_bounds(uint32_t bounds)
{
	ids.reserve(bounds);
	while (ids.size() < bounds)
		ids.emplace_back(pool_group.get());

	block_meta.resize(bounds);
}